

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update.c
# Opt level: O0

int move_gain(CHAR_DATA *ch)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  CHAR_DATA *in_RDI;
  int in_stack_0000000c;
  CHAR_DATA *in_stack_00000010;
  int gain;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int local_20;
  int in_stack_ffffffffffffffe4;
  int in_stack_ffffffffffffffe8;
  int local_4;
  
  if (in_RDI->in_room == (ROOM_INDEX_DATA *)0x0) {
    local_4 = 0;
  }
  else {
    bVar1 = is_affected(in_RDI,(int)gsn_atrophy);
    if ((bVar1) || (bVar1 = is_affected(in_RDI,(int)gsn_prevent_healing), bVar1)) {
      local_4 = 0;
    }
    else {
      bVar1 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
      if (!bVar1) {
        if (6 < in_RDI->pcdata->condition[4]) {
          return 5;
        }
        if (4 < in_RDI->pcdata->condition[5]) {
          return 5;
        }
      }
      bVar1 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
      if (bVar1) {
        iVar4 = (int)in_RDI->level;
      }
      else {
        in_stack_ffffffffffffffe8 = 0xf;
        in_stack_ffffffffffffffe4 = (int)in_RDI->level / 2;
        piVar5 = std::max<int>((int *)&stack0xffffffffffffffe8,(int *)&stack0xffffffffffffffe4);
        iVar4 = *piVar5;
        iVar2 = (int)in_RDI->position;
        if (iVar2 == 4) {
          iVar3 = get_curr_stat(in_stack_00000010,in_stack_0000000c);
          iVar4 = iVar3 + iVar4;
        }
        else if (iVar2 == 5) {
          iVar3 = get_curr_stat(in_stack_00000010,in_stack_0000000c);
          iVar4 = iVar3 / 2 + iVar4;
        }
        bVar1 = is_hungry((CHAR_DATA *)CONCAT44(iVar2,in_stack_ffffffffffffffd8));
        if (bVar1) {
          iVar4 = iVar4 / 2;
        }
        bVar1 = is_thirsty((CHAR_DATA *)CONCAT44(iVar2,in_stack_ffffffffffffffd8));
        if (bVar1) {
          iVar4 = iVar4 / 2;
        }
      }
      iVar4 = ((int)in_RDI->in_room->heal_rate / 100) * iVar4;
      if ((in_RDI->on != (OBJ_DATA *)0x0) && (in_RDI->on->item_type == 0xc)) {
        iVar4 = (iVar4 * 6) / 5;
      }
      bVar1 = is_affected_by((CHAR_DATA *)CONCAT44(iVar4,in_stack_ffffffffffffffe8),
                             in_stack_ffffffffffffffe4);
      if (bVar1) {
        iVar4 = iVar4 / 4;
      }
      bVar1 = is_affected_by((CHAR_DATA *)CONCAT44(iVar4,in_stack_ffffffffffffffe8),
                             in_stack_ffffffffffffffe4);
      if (bVar1) {
        iVar4 = iVar4 / 8;
      }
      bVar1 = is_affected_by((CHAR_DATA *)CONCAT44(iVar4,in_stack_ffffffffffffffe8),
                             in_stack_ffffffffffffffe4);
      if (!bVar1) {
        is_affected_by((CHAR_DATA *)CONCAT44(iVar4,in_stack_ffffffffffffffe8),
                       in_stack_ffffffffffffffe4);
      }
      bVar1 = is_affected(in_RDI,(int)gsn_camp);
      if (bVar1) {
        number_percent();
      }
      local_20 = (int)in_RDI->max_move - (int)in_RDI->move;
      piVar5 = std::min<int>((int *)&stack0xffffffffffffffec,&local_20);
      local_4 = *piVar5;
    }
  }
  return local_4;
}

Assistant:

int move_gain(CHAR_DATA *ch)
{
	int gain;

	if (ch->in_room == nullptr)
		return 0;

	if (is_affected(ch, gsn_atrophy) || is_affected(ch, gsn_prevent_healing))
		return 0;

	if (!is_npc(ch))
	{
		if (ch->pcdata->condition[COND_STARVING] > 6)
			return 5;

		if (ch->pcdata->condition[COND_DEHYDRATED] > 4)
			return 5;
	}

	if (is_npc(ch))
	{
		gain = ch->level;
	}
	else
	{
		gain = std::max(15, ch->level / 2);

		switch (ch->position)
		{
			case POS_SLEEPING:
				gain += get_curr_stat(ch, STAT_DEX);
				break;
			case POS_RESTING:
				gain += get_curr_stat(ch, STAT_DEX) / 2;
				break;
		}

		if (is_hungry(ch))
			gain /= 2;

		if (is_thirsty(ch))
			gain /= 2;
	}

	gain *= ch->in_room->heal_rate / 100;

	if (ch->on != nullptr && ch->on->item_type == ITEM_FURNITURE)
		gain = gain * 6 / 5;

	if (is_affected_by(ch, AFF_POISON))
		gain /= 4;

	if (is_affected_by(ch, AFF_PLAGUE))
		gain /= 8;

	if (is_affected_by(ch, AFF_HASTE) || is_affected_by(ch, AFF_SLOW))
		gain *= 2;

	if (is_affected(ch, gsn_camp))
	{
		if (number_percent() < ch->pcdata->learned[gsn_camp])
			gain *= 2;
	}
	gain *= 2;
	return std::min(gain, (int)(ch->max_move - ch->move));
}